

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::Divide
          (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
           *this,TPZVec<TPZGeoEl_*> *SubElVec)

{
  TPZReference *pTVar1;
  _Base_ptr p_Var2;
  TPZRefPattern *pTVar3;
  TPZRefPatternDataBase *pTVar4;
  TPZVec<TPZGeoEl_*> *pTVar5;
  MElementType elType;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  TPZGeoEl *pTVar11;
  undefined8 uVar12;
  long lVar13;
  long *plVar14;
  TPZGeoEl *pTVar15;
  TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *pTVar16;
  uint iel;
  ulong uVar17;
  uint uVar18;
  _func_int **pp_Var19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  bool bVar23;
  TPZGeoElSide neighbour;
  TPZGeoElSide gs;
  TPZAutoPointer<TPZRefPattern> uniform;
  int64_t index;
  TPZManVector<long,_30> np;
  TPZGeoElSide local_2b0;
  _func_int **local_298;
  TPZVec<TPZGeoEl_*> *local_290;
  TPZReference *local_288;
  ulong local_280;
  TPZAutoPointer<TPZRefPattern> local_278;
  TPZGeoElSide local_270;
  undefined1 local_258 [272];
  undefined1 local_148 [8];
  undefined1 local_140 [272];
  
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZRefPattern *)0x0))
  goto LAB_00f63b3e;
  elType = (**(code **)(*(long *)&(this->
                                  super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                  ).super_TPZGeoEl + 0xb8))(this);
  if (elType == EPoint) {
    return;
  }
  TPZRefPatternDataBase::GetUniformRefPattern((TPZRefPatternDataBase *)local_140,0x1a32400);
  if ((TPZRefPatternDataBase *)local_140._0_8_ == (TPZRefPatternDataBase *)0x0) {
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_140);
LAB_00f639f6:
    TPZRefPatternDataBase::InitializeUniformRefPattern(&gRefDBase,elType);
  }
  else {
    lVar13 = *(long *)&(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                          *)local_140._0_8_)->_M_t)._M_impl;
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_140);
    if (lVar13 == 0) goto LAB_00f639f6;
  }
  TPZRefPatternDataBase::GetUniformRefPattern((TPZRefPatternDataBase *)local_258,0x1a32400);
  local_140._16_8_ = (_Base_ptr)0x0;
  local_140._0_8_ = (TPZRefPatternDataBase *)local_140;
  local_140._8_8_ = (TPZRefPatternDataBase *)local_140;
  TPZRefPatternTools::GetCompatibleRefPatterns
            ((TPZGeoEl *)this,
             (list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> *
             )local_140);
  pTVar4 = (TPZRefPatternDataBase *)local_140._0_8_;
  while( true ) {
    if (pTVar4 == (TPZRefPatternDataBase *)local_140) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!",0x46);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      (*SubElVec->_vptr_TPZVec[3])(SubElVec,0);
      std::__cxx11::
      _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
      _M_clear((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)local_140);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
      return;
    }
    p_Var2 = (pTVar4->fElTypeRefPatterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var2 == (_Base_ptr)0x0) break;
    pTVar3 = *(TPZRefPattern **)p_Var2;
    if ((TPZReference *)local_258._0_8_ == (TPZReference *)0x0) {
joined_r0x00f63a86:
      if (pTVar3 == (TPZRefPattern *)0x0) goto LAB_00f63b05;
    }
    else if ((*(TPZRefPattern **)local_258._0_8_ != (TPZRefPattern *)0x0) ==
             (pTVar3 != (TPZRefPattern *)0x0)) goto LAB_00f63b05;
    pTVar4 = *(TPZRefPatternDataBase **)&(pTVar4->fElTypeRefPatterns)._M_t._M_impl;
  }
  if ((TPZReference *)local_258._0_8_ != (TPZReference *)0x0) {
    pTVar3 = *(TPZRefPattern **)local_258._0_8_;
    goto joined_r0x00f63a86;
  }
LAB_00f63b05:
  local_278.fRef = (TPZReference *)local_258._0_8_;
  LOCK();
  (((atomic_int *)(local_258._0_8_ + 8))->super___atomic_base<int>)._M_i =
       (((atomic_int *)(local_258._0_8_ + 8))->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (**(code **)(*(long *)&(this->
                         super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                         ).super_TPZGeoEl + 0x2a8))(this);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_278);
  std::__cxx11::
  _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
  _M_clear((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
            *)local_140);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
LAB_00f63b3e:
  local_290 = SubElVec;
  (**(code **)(*(long *)&(this->
                         super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                         ).super_TPZGeoEl + 0x2b0))(local_140,this);
  uVar6 = TPZRefPattern::NSubElements
                    (*(TPZRefPattern **)
                      &(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                          *)local_140._0_8_)->_M_t)._M_impl);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_140);
  iVar7 = (**(code **)(*(long *)&(this->
                                 super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                 ).super_TPZGeoEl + 0x1d0))(this);
  pTVar5 = local_290;
  if (iVar7 != 0) {
    (*local_290->_vptr_TPZVec[3])(local_290,(long)(int)uVar6);
    if ((int)uVar6 < 1) {
      return;
    }
    uVar17 = 0;
    do {
      pTVar11 = (TPZGeoEl *)
                (**(code **)(*(long *)&(this->
                                       super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                       ).super_TPZGeoEl + 0x1f8))(this,uVar17 & 0xffffffff);
      pTVar5->fStore[uVar17] = pTVar11;
      uVar17 = uVar17 + 1;
    } while (uVar6 != uVar17);
    return;
  }
  iVar7 = (this->
          super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>).
          super_TPZGeoEl.fMatId;
  (**(code **)(*(long *)&(this->
                         super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                         ).super_TPZGeoEl + 0x2b0))(local_140,this);
  iVar8 = TPZRefPattern::NNodes
                    (*(TPZRefPattern **)
                      &(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                          *)local_140._0_8_)->_M_t)._M_impl);
  local_280 = (ulong)uVar6;
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_140);
  local_258._0_8_ = (TPZReference *)0x0;
  TPZManVector<long,_30>::TPZManVector
            ((TPZManVector<long,_30> *)local_140,(long)iVar8,(long *)local_258);
  iVar8 = (**(code **)(*(long *)&(this->
                                 super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                 ).super_TPZGeoEl + 0x98))(this);
  if (0 < iVar8) {
    iVar22 = 0;
    do {
      uVar12 = (**(code **)(*(long *)&(this->
                                      super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                      ).super_TPZGeoEl + 0xa8))(this,iVar22);
      (**(code **)(*(long *)&(this->
                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             ).super_TPZGeoEl + 0x2b0))((TPZAutoPointer<TPZRefPattern> *)local_258);
      pTVar11 = TPZRefPattern::Element(*(TPZRefPattern **)local_258._0_8_,0);
      lVar13 = (**(code **)(*(long *)pTVar11 + 0xa8))(pTVar11,iVar22);
      *(undefined8 *)
       (&(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
            *)local_140._8_8_)->_M_t)._M_impl.field_0x0 + lVar13 * 8) = uVar12;
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
      iVar22 = iVar22 + 1;
    } while (iVar8 != iVar22);
  }
  (**(code **)(*(long *)&(this->
                         super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                         ).super_TPZGeoEl + 0x2b0))(local_258,this);
  TPZRefPattern::CreateNewNodes
            (*(TPZRefPattern **)local_258._0_8_,(TPZGeoEl *)this,(TPZVec<long> *)local_140);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
  if (0 < (int)uVar6) {
    local_288 = (TPZReference *)&PTR__TPZVec_01813f30;
    pp_Var19 = (_func_int **)0x0;
    do {
      (**(code **)(*(long *)&(this->
                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             ).super_TPZGeoEl + 0x2b0))((TPZManVector<long,_30> *)local_258,this);
      uVar18 = (int)pp_Var19 + 1;
      local_298 = pp_Var19;
      pTVar11 = TPZRefPattern::Element(*(TPZRefPattern **)local_258._0_8_,uVar18);
      uVar9 = (**(code **)(*(long *)pTVar11 + 0x98))(pTVar11);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
      TPZManVector<long,_30>::TPZManVector((TPZManVector<long,_30> *)local_258,(long)(int)uVar9);
      if (0 < (int)uVar9) {
        uVar17 = 0;
        do {
          (**(code **)(*(long *)&(this->
                                 super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                 ).super_TPZGeoEl + 0x2b0))(&local_2b0);
          pTVar11 = TPZRefPattern::Element
                              ((TPZRefPattern *)*local_2b0.super_TPZSavable._vptr_TPZSavable,uVar18)
          ;
          lVar13 = (**(code **)(*(long *)pTVar11 + 0xa8))(pTVar11,uVar17 & 0xffffffff);
          TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                    ((TPZAutoPointer<TPZRefPattern> *)&local_2b0);
          *(undefined8 *)((undefined1 *)local_258._8_8_ + uVar17 * 8) =
               *(undefined8 *)
                (&(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                     *)local_140._8_8_)->_M_t)._M_impl.field_0x0 + lVar13 * 8);
          uVar17 = uVar17 + 1;
        } while (uVar9 != uVar17);
      }
      (**(code **)(*(long *)&(this->
                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             ).super_TPZGeoEl + 0x2b0))(&local_2b0,this);
      pTVar11 = TPZRefPattern::Element
                          ((TPZRefPattern *)*local_2b0.super_TPZSavable._vptr_TPZSavable,uVar18);
      uVar10 = (**(code **)(*(long *)pTVar11 + 0xb8))(pTVar11);
      uVar12 = (**(code **)(*(long *)&(this->
                                      super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                      ).super_TPZGeoEl + 0x168))
                         (this,uVar10,(TPZManVector<long,_30> *)local_258,iVar7,local_148);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)&local_2b0);
      (**(code **)(*(long *)&(this->
                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             ).super_TPZGeoEl + 0x1b0))(this,local_298,uVar12);
      if ((TPZGeoEl *)local_258._8_8_ != (TPZGeoEl *)(local_258 + 0x20)) {
        local_258._24_8_ = (_Base_ptr)0x0;
        local_258._0_8_ = local_288;
        if ((TPZGeoEl *)local_258._8_8_ != (TPZGeoEl *)0x0) {
          operator_delete__((void *)local_258._8_8_);
        }
      }
      pp_Var19 = (_func_int **)(ulong)uVar18;
    } while (uVar18 != uVar6);
  }
  (*local_290->_vptr_TPZVec[3])(local_290,(long)(int)uVar6);
  uVar17 = local_280;
  pTVar5 = local_290;
  if (0 < (int)uVar6) {
    uVar21 = 0;
    do {
      pTVar11 = (TPZGeoEl *)
                (**(code **)(*(long *)&(this->
                                       super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                       ).super_TPZGeoEl + 0x1f8))(this,uVar21 & 0xffffffff);
      pTVar5->fStore[uVar21] = pTVar11;
      pTVar11 = pTVar5->fStore[uVar21];
      pTVar11->fFatherIndex =
           (this->
           super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>).
           super_TPZGeoEl.fIndex;
      (**(code **)(*(long *)pTVar11 + 0x1f0))();
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
    if (0 < (int)uVar6) {
      local_298 = (_func_int **)&PTR__TPZGeoElSide_018f8760;
      uVar9 = 0;
      do {
        (**(code **)(*(long *)&(this->
                               super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                               ).super_TPZGeoEl + 0x2b0))(local_258,this);
        uVar18 = uVar9 + 1;
        pTVar11 = TPZRefPattern::Element(*(TPZRefPattern **)local_258._0_8_,uVar18);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_258);
        for (iVar7 = 0; iVar8 = (**(code **)(*(long *)pTVar11 + 0xf0))(pTVar11), iVar7 < iVar8;
            iVar7 = iVar7 + 1) {
          (**(code **)(*(long *)pTVar11 + 0x188))(local_258,pTVar11,iVar7);
          if (((int)local_258._16_4_ < 0 || (TPZGeoEl *)local_258._8_8_ == (TPZGeoEl *)0x0) ||
             ((TPZGeoEl *)local_258._8_8_ == pTVar11 && local_258._16_4_ == iVar7)) {
            plVar14 = (long *)(**(code **)(*(long *)&(this->
                                                  super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                                  ).super_TPZGeoEl + 0x1f8))(this,uVar9);
            local_2b0.fGeoEl =
                 (TPZGeoEl *)
                 (**(code **)(*(long *)&(this->
                                        super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                        ).super_TPZGeoEl + 0x1f8))(this,uVar9);
            local_2b0.super_TPZSavable._vptr_TPZSavable = local_298;
            local_2b0.fSide = iVar7;
            (**(code **)(*plVar14 + 0x198))(plVar14,iVar7,&local_2b0);
          }
          else {
            uVar20 = 0xffffffff;
            do {
              (**(code **)(*(long *)&(this->
                                     super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                     ).super_TPZGeoEl + 0x2b0))(&local_2b0,this);
              iel = uVar20 + 1;
              pTVar15 = TPZRefPattern::Element
                                  ((TPZRefPattern *)*local_2b0.super_TPZSavable._vptr_TPZSavable,iel
                                  );
              bVar23 = pTVar15 == (TPZGeoEl *)local_258._8_8_;
              TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                        ((TPZAutoPointer<TPZRefPattern> *)&local_2b0);
              if (uVar9 != uVar20 && bVar23) {
                local_2b0.super_TPZSavable._vptr_TPZSavable = local_298;
                local_2b0.fGeoEl = (TPZGeoEl *)0x0;
                local_2b0.fSide = -1;
                pTVar16 = this;
                if (uVar20 != 0xffffffff) {
                  pTVar16 = (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             *)(**(code **)(*(long *)&(this->
                                                  super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                                  ).super_TPZGeoEl + 0x1f8))(this,uVar20);
                }
                local_2b0.fSide = local_258._16_4_;
                local_2b0.fGeoEl = (TPZGeoEl *)pTVar16;
                local_270.fGeoEl =
                     (TPZGeoEl *)
                     (**(code **)(*(long *)&(this->
                                            super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                            ).super_TPZGeoEl + 0x1f8))(this,uVar9);
                local_270.super_TPZSavable._vptr_TPZSavable = local_298;
                local_270.fSide = iVar7;
                iVar8 = TPZGeoElSide::NeighbourExists(&local_270,&local_2b0);
                if (iVar8 == 0) {
                  TPZGeoElSide::SetConnectivity(&local_270,&local_2b0);
                }
                break;
              }
              uVar20 = iel;
            } while ((uint)local_280 != iel);
          }
        }
        uVar9 = uVar18;
      } while (uVar18 != uVar6);
    }
  }
  (**(code **)(*(long *)&(this->
                         super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                         ).super_TPZGeoEl + 0x1b8))(this);
  if ((TPZRefPatternDataBase *)local_140._8_8_ == (TPZRefPatternDataBase *)(local_140 + 0x20)) {
    return;
  }
  local_140._24_8_ = (_Base_ptr)0x0;
  local_140._0_8_ = &PTR__TPZVec_01813f30;
  if ((TPZRefPatternDataBase *)local_140._8_8_ == (TPZRefPatternDataBase *)0x0) {
    return;
  }
  operator_delete__((void *)local_140._8_8_);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Divide(TPZVec<TPZGeoEl *> &SubElVec){
	if (!fRefPattern) {
		MElementType typeel = this->Type();
		if(typeel == EPoint)
			return;
		if(!gRefDBase.GetUniformRefPattern(typeel))
		{
			gRefDBase.InitializeUniformRefPattern(typeel);
		}
		TPZAutoPointer<TPZRefPattern> uniform = gRefDBase.GetUniformRefPattern(typeel);
		std::list<TPZAutoPointer<TPZRefPattern> > compat;
		TPZRefPatternTools::GetCompatibleRefPatterns(this,compat);
		std::list<TPZAutoPointer<TPZRefPattern> >::iterator it = compat.begin();
		while(it != compat.end()){
			if(*it == uniform) break;
			it++;
		}
		if(it != compat.end())
		{
			this->SetRefPattern(uniform);
		}
		else
		{
			PZError << "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!" << std::endl;
			SubElVec.Resize(0);
			return;
		}
	}
	int i;
	int NSubEl = this->GetRefPattern()->NSubElements();
	if(HasSubElement()) {
		SubElVec.Resize(NSubEl);
		for(i=0;i<NSubEl;i++) SubElVec[i] = SubElement(i);
#ifdef PZ_LOG
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if(loggerrefpattern.isWarnEnabled())
		{
			std::stringstream sout;
			sout << "Trying to divide element which has subelements " << this->Index() << std::endl;
			sout << "Subelement indices ";
			for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
			LOGPZ_WARN(loggerrefpattern,sout.str());
		}
#endif
		return;//If exist fSubEl return this sons
	}
	int64_t index;
	int j, k, sub, matid=this->MaterialId();
	
	int64_t totalnodes = this->GetRefPattern()->NNodes();
	TPZManVector<int64_t,30> np(totalnodes,0);
	int nnodes = this->NCornerNodes();
	
	for(j=0;j<nnodes;j++) {
		np[this->GetRefPattern()->Element(0)->NodeIndex(j)] = this->NodeIndex(j);
	}
	this->GetRefPattern()->CreateNewNodes (this, np);
	//std::cout << "NewNodeIndexes : " << np << std::endl;
	
	// creating new subelements
	for(i=0;i<NSubEl;i++) {
		int subcorner = this->GetRefPattern()->Element(i+1)->NCornerNodes();
		TPZManVector<int64_t,30> cornerindexes(subcorner);
		for(j=0;j<subcorner;j++) {
			int64_t cornerid = this->GetRefPattern()->Element(i+1)->NodeIndex(j);
			cornerindexes[j] = np[cornerid];
		}
		//std::cout << "Subel corner " << cornerindexes << std::endl;
		TPZGeoEl *subel = this->CreateGeoElement((MElementType)this->GetRefPattern()->Element(i+1)->Type(),cornerindexes,matid,index);
		SetSubElement(i,subel);
	}
	
	SubElVec.Resize(NSubEl);
	for(sub=0;sub<NSubEl;sub++) {
		SubElVec[sub] = SubElement(sub);
		SubElVec[sub]->SetFather(this);
		SubElVec[sub]->SetFatherIndex(this->fIndex);
	}

	for(i=0;i<NSubEl;i++) {
		//std::cout << "SubElement " << i << std::endl;
		TPZGeoEl *refsubel = this->GetRefPattern()->Element(i+1);
		for (j=0;j<refsubel->NSides();j++){
			//std::cout << "\t Side " << j << std::endl;
			TPZGeoElSide thisside (refsubel,j);
			TPZGeoElSide refneigh = refsubel->Neighbour(j);
			if(refneigh.Exists() && refneigh != thisside) {
				//como nao me deixam guardar o index do elemento geometrico...
				for (k=0;k<NSubEl+1;k++){
					if (this->GetRefPattern()->Element(k) == refneigh.Element() && k-1 != i){
						//    std::cout << "\t\t\tFound subel " << k << "  side of subel " << refneigh.Side()
						//      << "For subelement " << i << " side " << j << std::endl;
						TPZGeoElSide neighbour;
						if(k) {
							neighbour = TPZGeoElSide(SubElement(k-1),refneigh.Side());
						} else {
							neighbour = TPZGeoElSide(this, refneigh.Side());
						}
						TPZGeoElSide gs(SubElement(i),j);
						if(!gs.NeighbourExists(neighbour)) gs.SetConnectivity(neighbour);
						break;
					}
				}
				if(k == NSubEl+1) {
					//std::cout << "TPZGeoElRefPattern<TGeo>::Divide inconsistent datastructure subelement "
					//  << i << " Side " << j << std::endl;
				}
			} else {
				SubElement(i)->SetNeighbour(j,TPZGeoElSide(SubElement(i),j));
			}
		}
	}
	
	this->SetSubElementConnectivities();
#ifdef PZ_LOG
    {
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if (loggerrefpattern.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Dividing element " << this->Index() << std::endl;
            sout << "Subelement indices ";
            for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
            LOGPZ_DEBUG(loggerrefpattern,sout.str())
        }
    }
#endif
}